

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcSaucy.c
# Opt level: O0

void saucy_search(Abc_Ntk_t *pNtk,saucy *s,int directed,int *colors,saucy_stats *stats)

{
  Abc_Ntk_t *pAVar1;
  saucy_graph *psVar2;
  int iVar3;
  saucy_graph *g;
  int local_38;
  int max;
  int j;
  int i;
  saucy_stats *stats_local;
  int *colors_local;
  int directed_local;
  saucy *s_local;
  Abc_Ntk_t *pNtk_local;
  
  g._4_4_ = 0;
  s->pNtk = pNtk;
  pAVar1 = Abc_NtkDup(pNtk);
  s->pNtk_permuted = pAVar1;
  psVar2 = buildDepGraph(pNtk,s->iDep,s->oDep);
  s->n = psVar2->n;
  s->depAdj = psVar2->adj;
  s->depEdg = psVar2->edg;
  s->stats = stats;
  if (directed == 0) {
    s->is_automorphism = is_undirected_automorphism;
    s->ref_singleton = ref_singleton_undirected;
    s->ref_nonsingle = ref_nonsingle_undirected;
  }
  else {
    s->is_automorphism = is_directed_automorphism;
    s->ref_singleton = ref_singleton_directed;
    s->ref_nonsingle = ref_nonsingle_directed;
  }
  s->indmin = 0;
  s->anc = 1;
  s->lev = 1;
  s->ndiffnons = 0;
  s->nundiffs = 0;
  s->ndiffs = 0;
  s->activityInc = 1.0;
  for (max = 0; max < s->n; max = max + 1) {
    s->theta[max] = max;
  }
  for (max = 0; max < s->n; max = max + 1) {
    s->gamma[max] = max;
  }
  for (max = 0; max < s->n; max = max + 1) {
    s->thsize[max] = 1;
  }
  for (max = 0; max < s->n; max = max + 1) {
    s->thnext[max] = max;
    s->thprev[max] = max;
  }
  s->npairs = 0;
  for (max = 0; max < s->n; max = max + 1) {
    s->unpairs[max] = -1;
  }
  for (max = 0; max < s->n; max = max + 1) {
    s->undiffnons[max] = -1;
  }
  s->stats->grpsize_base = 1.0;
  s->stats->grpsize_exp = 0;
  s->stats->nodes = 1;
  s->stats->support = 0;
  s->stats->gens = 0;
  s->stats->bads = 0;
  s->nsinduce = 0;
  s->nninduce = 0;
  s->csize = 0;
  for (max = 0; max < s->n; max = max + 1) {
    s->ccount[colors[max]] = s->ccount[colors[max]] + 1;
    if (g._4_4_ < colors[max]) {
      g._4_4_ = colors[max];
    }
  }
  s->nsplits = g._4_4_ + 1;
  *(s->left).clen = *s->ccount + -1;
  for (max = 0; max < g._4_4_; max = max + 1) {
    (s->left).clen[s->ccount[max]] = s->ccount[max + 1] + -1;
    s->ccount[max + 1] = s->ccount[max] + s->ccount[max + 1];
  }
  for (max = 0; max < s->n; max = max + 1) {
    iVar3 = s->ccount[colors[max]] + -1;
    s->ccount[colors[max]] = iVar3;
    set_label(&s->left,iVar3,max);
  }
  for (max = 0; max <= g._4_4_; max = max + 1) {
    s->ccount[max] = 0;
  }
  for (max = 0; max < s->n; max = (s->left).clen[max] + 1 + max) {
    add_induce(s,&s->left,max);
    fix_fronts(&s->left,max,max);
  }
  local_38 = -1;
  for (max = 0; max < s->n; max = (s->left).clen[max] + 1 + max) {
    if ((s->left).clen[max] != 0) {
      s->prevnon[max] = local_38;
      s->nextnon[local_38] = max;
      local_38 = max;
    }
  }
  s->prevnon[s->n] = local_38;
  s->nextnon[local_38] = s->n;
  s->split = split_init;
  s->refineBySim1 = refineBySim1_init;
  s->refineBySim2 = refineBySim2_init;
  printf("Initial Refine by Dependency graph ... ");
  refineByDepGraph(s,&s->left);
  printf("done!\n");
  printf("Initial Refine by Simulation ... ");
  printf("done!\n\t--------------------\n");
  s->refineBySim1 = refineBySim1_left;
  s->refineBySim2 = refineBySim2_left;
  descend_leftmost(s);
  s->split = split_other;
  s->refineBySim1 = refineBySim1_other;
  s->refineBySim2 = refineBySim2_other;
  s->anc = s->lev;
  s->stats->levels = s->lev;
  memcpy((s->right).lab,(s->left).lab,(long)s->n << 2);
  memcpy((s->right).unlab,(s->left).unlab,(long)s->n << 2);
  memcpy((s->right).clen,(s->left).clen,(long)s->n << 2);
  memcpy((s->right).cfront,(s->left).cfront,(long)s->n << 2);
  memcpy(s->threp,(s->left).lab,(long)s->n << 2);
  memcpy(s->thfront,(s->left).unlab,(long)s->n << 2);
  s->select_decomposition = select_statically;
  do {
    iVar3 = do_search(s);
  } while (iVar3 != 0);
  return;
}

Assistant:

void
saucy_search(
    Abc_Ntk_t * pNtk,
    struct saucy *s,
    int directed,
    const int *colors,
    struct saucy_stats *stats)
{
    int i, j, max = 0;  
    struct saucy_graph *g;

    extern Abc_Ntk_t * Abc_NtkDup( Abc_Ntk_t * pNtk );

    /* Save network information */
    s->pNtk = pNtk;
    s->pNtk_permuted = Abc_NtkDup( pNtk );  

    /* Builde dependency graph */
    g = buildDepGraph(pNtk, s->iDep, s->oDep);  

    /* Save graph information */
    s->n = g->n;
    s->depAdj = g->adj;
    s->depEdg = g->edg;
    /*s->dadj = g->adj + g->n + 1;
    s->dedg = g->edg + g->e;*/

    /* Save client information */
    s->stats = stats;       

    /* Polymorphism */
    if (directed) {
        s->is_automorphism = is_directed_automorphism;
        s->ref_singleton = ref_singleton_directed;
        s->ref_nonsingle = ref_nonsingle_directed;
    }
    else {
        s->is_automorphism = is_undirected_automorphism;
        s->ref_singleton = ref_singleton_undirected;
        s->ref_nonsingle = ref_nonsingle_undirected;
    }

    /* Initialize scalars */
    s->indmin = 0;  
    s->lev = s->anc = 1;
    s->ndiffs = s->nundiffs = s->ndiffnons = 0;
    s->activityInc = 1;

    /* The initial orbit partition is discrete */
    for (i = 0; i < s->n; ++i) {
        s->theta[i] = i;
    }

    /* The initial permutation is the identity */
    for (i = 0; i < s->n; ++i) {
        s->gamma[i] = i;
    }

    /* Initially every cell of theta has one element */
    for (i = 0; i < s->n; ++i) {
        s->thsize[i] = 1;
    }

    /* Every theta rep list is singleton */
    for (i = 0; i < s->n; ++i) {
        s->thprev[i] = s->thnext[i] = i;
    }

    /* We have no pairs yet */
    s->npairs = 0;
    for (i = 0; i < s->n; ++i) {
        s->unpairs[i] = -1;
    }

    /* Ensure no stray pointers in undiffnons, which is checked by removed_diffnon() */
    for (i = 0; i < s->n; ++i) {
        s->undiffnons[i] = -1;
    }

    /* Initialize stats */
    s->stats->grpsize_base = 1.0;
    s->stats->grpsize_exp = 0;
    s->stats->nodes = 1;
    s->stats->bads = s->stats->gens = s->stats->support = 0;

    /* Prepare for refinement */
    s->nninduce = s->nsinduce = 0;
    s->csize = 0;

    /* Count cell sizes */
    for (i = 0; i < s->n; ++i) {
        s->ccount[colors[i]]++;
        if (max < colors[i]) max = colors[i];
    }
    s->nsplits = max + 1;

    /* Build cell lengths */
    s->left.clen[0] = s->ccount[0] - 1;
    for (i = 0; i < max; ++i) {
        s->left.clen[s->ccount[i]] = s->ccount[i+1] - 1;
        s->ccount[i+1] += s->ccount[i];
    }

    /* Build the label array */
    for (i = 0; i < s->n; ++i) {
        set_label(&s->left, --s->ccount[colors[i]], i);
    }

    /* Clear out ccount */
    for (i = 0; i <= max; ++i) {
        s->ccount[i] = 0;
    }

    /* Update refinement stuff based on initial partition */
    for (i = 0; i < s->n; i += s->left.clen[i]+1) {
        add_induce(s, &s->left, i);
        fix_fronts(&s->left, i, i);
    }

    /* Prepare lists based on cell lengths */
    for (i = 0, j = -1; i < s->n; i += s->left.clen[i] + 1) {
        if (!s->left.clen[i]) continue;
        s->prevnon[i] = j;
        s->nextnon[j] = i;
        j = i;
    }

    /* Fix the end */
    s->prevnon[s->n] = j;
    s->nextnon[j] = s->n;

    /* Preprocessing after initial coloring */
    s->split = split_init;  
    s->refineBySim1 = refineBySim1_init;
    s->refineBySim2 = refineBySim2_init;    

    //print_partition(&s->left, NULL, s->n, s->pNtk, 1);
    printf("Initial Refine by Dependency graph ... ");
    refineByDepGraph(s, &s->left);
    //print_partition(&s->left, NULL, s->n, s->pNtk, 1);
    printf("done!\n");
    
    printf("Initial Refine by Simulation ... ");
    if (REFINE_BY_SIM_1) s->refineBySim1(s, &s->left);
    //print_partition(&s->left, NULL, s->n, s->pNtk, 1);
    if (REFINE_BY_SIM_2) s->refineBySim2(s, &s->left);
    //print_partition(&s->left, NULL, s->n, s->pNtk, 1);
    printf("done!\n\t--------------------\n");

    /* Descend along the leftmost branch and compute zeta */
    s->refineBySim1 = refineBySim1_left;
    s->refineBySim2 = refineBySim2_left;
    descend_leftmost(s);    
    s->split = split_other; 
    s->refineBySim1 = refineBySim1_other;
    s->refineBySim2 = refineBySim2_other;   

    /* Our common ancestor with zeta is the current level */
    s->stats->levels = s->anc = s->lev;

    /* Copy over this data to our non-leftmost coloring */
    memcpy(s->right.lab, s->left.lab, s->n * sizeof(int));
    memcpy(s->right.unlab, s->left.unlab, s->n * sizeof(int));
    memcpy(s->right.clen, s->left.clen, s->n * sizeof(int));
    memcpy(s->right.cfront, s->left.cfront, s->n * sizeof(int));

    /* The reps are just the labels at this point */
    memcpy(s->threp, s->left.lab, s->n * sizeof(int));
    memcpy(s->thfront, s->left.unlab, s->n * sizeof(int));

    /* choose cell selection method */
    if (SELECT_DYNAMICALLY) s->select_decomposition = select_dynamically;
    else                    s->select_decomposition = select_statically;

    /* Keep running till we're out of automorphisms */
    while (do_search(s));
}